

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeBee.cpp
# Opt level: O1

void TeeBee::CalcPattern(Data *data)

{
  uint uVar1;
  long lVar2;
  int i;
  float fVar3;
  
  fVar3 = data->p[0] * 1000.0;
  lVar2 = (long)fVar3;
  uVar1 = (uint)lVar2 | (uint)(long)(fVar3 - 9.223372e+18) & (uint)(lVar2 >> 0x3f);
  lVar2 = 0;
  do {
    uVar1 = uVar1 * 0x19660d + 0x3c6ef35f;
    fVar3 = exp2f((float)((int)((float)(uVar1 & 0xffffff ^ uVar1 >> 0x10) *
                                (data->p[2] - data->p[1]) * 5.960465e-08 + data->p[1]) + -0x3c) /
                  12.0);
    data->pattern[lVar2] = fVar3 * 440.0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

static void CalcPattern(EffectData::Data* data)
    {
        Random random;
        random.Seed((unsigned long)(data->p[P_SEED] * 1000));
        for (int i = 0; i < 64; i++)
        {
            int note = (int)random.GetFloat(data->p[P_MINNOTE], data->p[P_MAXNOTE]);
            data->pattern[i] = 440.0f * powf(2.0f, (note - 60) / 12.0f);
        }
    }